

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Vector<128> * __thiscall
Matrix<128,_784>::operator*
          (Vector<128> *__return_storage_ptr__,Matrix<128,_784> *this,Vector<784> *vector)

{
  double dVar1;
  const_reference this_00;
  const_reference pvVar2;
  double *pdVar3;
  double dVar4;
  undefined4 local_2c;
  undefined4 local_28;
  int j;
  int i;
  Vector<784> *vector_local;
  Matrix<128,_784> *this_local;
  Vector<128> *result;
  
  Vector<128>::Vector(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 0x80; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 0x310; local_2c = local_2c + 1) {
      dVar4 = Vector<784>::operator[](vector,local_2c);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->m_Matrix,(long)local_28);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_2c);
      dVar1 = *pvVar2;
      pdVar3 = Vector<128>::operator[](__return_storage_ptr__,local_28);
      *pdVar3 = dVar4 * dVar1 + *pdVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<ROWS> operator*(const Vector<COLS> &vector) const
    {
        Vector<ROWS> result{};
        for (int i = 0; i < ROWS; ++i)
        {
            for (int j = 0; j < COLS; ++j)
            {
                result[i] += vector[j] * m_Matrix[i][j];
            }
        }

        return result;
    }